

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O3

void __thiscall implementations::scheme::SchemeFrame::nextArgument(SchemeFrame *this)

{
  bool bVar1;
  cell *value;
  
  value = (this->arg_it)._M_current;
  if (value != (this->arguments).
               super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar1 = resolveArgument(this,value);
      if (!bVar1) {
        return;
      }
      value = (this->arg_it)._M_current + 1;
      (this->arg_it)._M_current = value;
    } while (value != (this->arguments).
                      super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar1 = dispatchCall(this);
  if (!bVar1) {
    return;
  }
  nextExpression(this);
  return;
}

Assistant:

void nextArgument() {
		if (arg_it == arguments.cend())
			dispatch();
		else if (resolveArgument(*arg_it)) {
			++arg_it;
			nextArgument();
		}
	}